

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ArenaStringPtr::SetAllocated
          (ArenaStringPtr *this,string *default_value,string *value,Arena *arena)

{
  bool bVar1;
  string *this_00;
  Arena *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ArenaStringPtr *in_stack_00000080;
  string *in_stack_ffffffffffffffc8;
  ArenaStringPtr *in_stack_ffffffffffffffd0;
  
  if (((in_RCX == (Arena *)0x0) &&
      (bVar1 = IsDefault(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8), !bVar1)) &&
     (this_00 = UnsafeMutablePointer_abi_cxx11_(in_stack_00000080), this_00 != (string *)0x0)) {
    std::__cxx11::string::~string((string *)this_00);
    operator_delete(this_00,0x20);
  }
  if (in_RDX == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Set
              ((TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_RDI,in_RSI);
  }
  else {
    TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Set
              ((TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_RDI,in_RDX);
    if (in_RCX != (Arena *)0x0) {
      Arena::Own<std::__cxx11::string>(in_RCX,in_RDI);
    }
  }
  return;
}

Assistant:

void ArenaStringPtr::SetAllocated(const std::string* default_value,
                                  std::string* value, ::google::protobuf::Arena* arena) {
  // Release what we have first.
  if (arena == nullptr && !IsDefault(default_value)) {
    delete UnsafeMutablePointer();
  }
  if (value == nullptr) {
    tagged_ptr_.Set(const_cast<std::string*>(default_value));
  } else {
#ifdef NDEBUG
    tagged_ptr_.Set(value);
    if (arena != nullptr) {
      arena->Own(value);
    }
#else
    // On debug builds, copy the string so the address differs.  delete will
    // fail if value was a stack-allocated temporary/etc., which would have
    // failed when arena ran its cleanup list.
    std::string* new_value = Arena::Create<std::string>(arena, *value);
    delete value;
    tagged_ptr_.Set(new_value);
#endif
  }
}